

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O1

wchar_t inven_damage(player *p,wchar_t type,wchar_t cperc)

{
  uint32_t *puVar1;
  byte *pbVar2;
  player_body *ppVar3;
  undefined2 uVar4;
  object *poVar5;
  object *poVar6;
  player_upkeep *ppVar7;
  _Bool _Var8;
  char cVar9;
  short sVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  char *pcVar13;
  undefined8 extraout_RDX;
  object *extraout_RDX_00;
  object *poVar14;
  object *poVar15;
  char *pcVar16;
  object *obj;
  char cVar17;
  uint uVar18;
  long lVar19;
  char *pcVar20;
  _Bool none_left;
  object *destroyed;
  char o_name [80];
  _Bool local_b1;
  wchar_t local_b0;
  wchar_t local_ac;
  player *local_a8;
  long local_a0;
  wchar_t local_98;
  undefined4 local_94;
  object *local_90;
  char local_88 [88];
  
  local_ac = L'\0';
  if (p->gear != (object *)0x0 && L'\0' < cperc) {
    ppVar3 = &p->body;
    lVar19 = (long)type;
    local_98 = (uint)cperc >> 2;
    local_ac = L'\0';
    obj = p->gear;
    local_b0 = cperc;
    local_a8 = p;
    local_a0 = lVar19;
    do {
      poVar5 = obj->next;
      _Var8 = object_is_equipped(*ppVar3,obj);
      poVar15 = poVar5;
      if (((!_Var8) && (obj->artifact == (artifact *)0x0)) &&
         ((obj->el_info[lVar19].flags & 3) == 1)) {
        _Var8 = tval_is_weapon(obj);
        if ((!_Var8) || (_Var8 = tval_is_ammo(obj), _Var8)) {
          _Var8 = tval_is_armor(obj);
          if (_Var8) {
            wVar11 = Rand_div(10000);
            if (cperc <= wVar11) goto LAB_001b0bee;
            sVar10 = obj->to_a + -1;
            obj->to_a = sVar10;
            local_94 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
            if (p->obj_k->to_a != 0) {
              obj->known->to_a = sVar10;
            }
          }
          else {
            _Var8 = tval_is_rod(obj);
            if (_Var8) {
              cperc = local_98;
            }
            local_94 = 0;
          }
        }
        else {
          wVar11 = Rand_div(10000);
          if (cperc <= wVar11) goto LAB_001b0bee;
          uVar4 = obj->to_h;
          obj->to_h = uVar4 + -1;
          poVar6 = p->obj_k;
          poVar14 = extraout_RDX_00;
          if (poVar6->to_h != 0) {
            poVar14 = obj->known;
            poVar14->to_h = uVar4 + -1;
          }
          sVar10 = obj->to_d + -1;
          obj->to_d = sVar10;
          local_94 = (undefined4)CONCAT71((int7)((ulong)poVar14 >> 8),1);
          if (poVar6->to_d != 0) {
            obj->known->to_d = sVar10;
          }
        }
        if ((char)local_94 == '\0') {
          if (obj->number == '\0') {
            wVar11 = L'\0';
          }
          else {
            wVar11 = L'\0';
            uVar18 = 0;
            do {
              wVar12 = Rand_div(10000);
              wVar11 = wVar11 + (uint)(wVar12 < cperc);
              uVar18 = uVar18 + 1;
            } while (uVar18 < obj->number);
          }
        }
        else {
          ppVar7 = p->upkeep;
          puVar1 = &ppVar7->update;
          *puVar1 = *puVar1 | 1;
          pbVar2 = (byte *)((long)&ppVar7->redraw + 2);
          *pbVar2 = *pbVar2 | 4;
          wVar11 = (wchar_t)obj->number;
        }
        p = local_a8;
        lVar19 = local_a0;
        cperc = local_b0;
        if (wVar11 != L'\0') {
          local_b1 = false;
          object_desc(local_88,0x50,obj,0,local_a8);
          pcVar20 = "Y";
          if (((1 < obj->number) && (pcVar20 = "All of y", wVar11 != (uint)obj->number)) &&
             (pcVar20 = "One of y", L'\x01' < wVar11)) {
            pcVar20 = "Some of y";
          }
          cVar9 = gear_to_label(local_a8,obj);
          pcVar16 = "was";
          if (L'\x01' < wVar11) {
            pcVar16 = "were";
          }
          cVar17 = (char)local_94;
          pcVar13 = "destroyed";
          if (cVar17 != '\0') {
            pcVar13 = "damaged";
          }
          msgt(0x21,"%sour %s (%c) %s %s!",pcVar20,local_88,(ulong)(uint)(int)cVar9,pcVar16,pcVar13)
          ;
          poVar15 = obj;
          p = local_a8;
          lVar19 = local_a0;
          cperc = local_b0;
          if (cVar17 == '\0') {
            local_90 = gear_object_for_use(local_a8,obj,wVar11,false,&local_b1);
            lVar19 = local_a0;
            cperc = local_b0;
            if (local_90->known != (object *)0x0) {
              object_delete((chunk *)0x0,(chunk *)0x0,&local_90->known);
            }
            object_delete((chunk *)0x0,(chunk *)0x0,&local_90);
            local_ac = local_ac + wVar11;
            poVar15 = poVar5;
            p = local_a8;
          }
        }
      }
LAB_001b0bee:
      obj = poVar15;
    } while (poVar15 != (object *)0x0);
  }
  return local_ac;
}

Assistant:

int inven_damage(struct player *p, int type, int cperc)
{
	int j, k, amt;
	struct object *obj = p->gear;
	char o_name[80];
	bool damage;

	/* No chance means no damage */
	if (cperc <= 0)
		return 0;

	/* Count the casualties */
	k = 0;

	/* Scan through the gear */
	while (obj) {
		struct object *next = obj->next;
		if (object_is_equipped(p->body, obj)) {
			obj = next;
			continue;
		}

		/* Hack -- for now, skip artifacts */
		if (obj->artifact) {
			obj = next;
			continue;
		}

		/* Give this item slot a shot at death if it is vulnerable */
		if ((obj->el_info[type].flags & EL_INFO_HATES) &&
			!(obj->el_info[type].flags & EL_INFO_IGNORE)) {
			/* Chance to destroy this item */
			int chance = cperc;

			/* Track if it is damaged instead of destroyed */
			damage = false;

			/* Analyze the type to see if we just damage it
			 * - we also check for rods to reduce chance */
			if (tval_is_weapon(obj) && !tval_is_ammo(obj)) {
				/* Chance to damage it */
				if (randint0(10000) < cperc) {
					/* Damage the item */
					obj->to_h--;
					if (p->obj_k->to_h)
						obj->known->to_h = obj->to_h;
					obj->to_d--;
					if (p->obj_k->to_d)
						obj->known->to_d = obj->to_d;

					/* Damaged! */
					damage = true;
				} else {
					obj = next;
					continue;
				}
			} else if (tval_is_armor(obj)) {
				/* Chance to damage it */
				if (randint0(10000) < cperc) {
					/* Damage the item */
					obj->to_a--;
					if (p->obj_k->to_a)
						obj->known->to_a = obj->to_a;

					/* Damaged! */
					damage = true;
				} else {
					obj = next;
					continue;
				}
			} else if (tval_is_rod(obj)) {
				chance = (chance / 4);
			}


			/* Damage instead of destroy */
			if (damage) {
				p->upkeep->update |= (PU_BONUS);
				p->upkeep->redraw |= (PR_EQUIP);

				/* Casualty count */
				amt = obj->number;
			} else
				/* ... or count the casualties */
				for (amt = j = 0; j < obj->number; ++j)
					if (randint0(10000) < chance) amt++;

			/* Some casualities */
			if (amt) {
				struct object *destroyed;
				bool none_left = false;

				/* Get a description */
				object_desc(o_name, sizeof(o_name), obj,
					ODESC_BASE, p);

				/* Message */
				msgt(MSG_DESTROY, "%sour %s (%c) %s %s!",
				           ((obj->number > 1) ?
				            ((amt == obj->number) ? "All of y" :
				             (amt > 1 ? "Some of y" : "One of y")) : "Y"),
				           o_name, gear_to_label(p, obj),
				           ((amt > 1) ? "were" : "was"),
					   (damage ? "damaged" : "destroyed"));

				/* Damage already done? */
				if (damage)
					continue;

				/* Destroy "amt" items */
				destroyed = gear_object_for_use(p, obj, amt,
					false, &none_left);
				if (destroyed->known)
					object_delete(NULL, NULL, &destroyed->known);
				object_delete(NULL, NULL, &destroyed);

				/* Count the casualties */
				k += amt;
			}
		}
		obj = next;
	}

	/* Return the casualty count */
	return (k);
}